

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

bool cfd::TransactionContextUtil::IsOpTrueLockingScript(UtxoData *utxo,AbstractTxIn *txin)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  ScriptOperator *this;
  undefined8 uVar4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> locking_script_items;
  Script *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff16;
  byte in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff18;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff20;
  CfdException *this_00;
  allocator local_c1;
  string local_c0 [94];
  undefined1 local_62;
  undefined1 local_61 [49];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_30;
  byte local_1;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  cfd::core::Script::GetElementList();
  sVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    (&local_30);
  if (sVar3 == 1) {
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
              (&local_30,0);
    this = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
    bVar1 = cfd::core::ScriptOperator::operator==
                      (this,(ScriptOperator *)&core::ScriptOperator::OP_TRUE);
    if ((bVar1 & 1) != 0) {
      iVar2 = cfd::core::AbstractTxIn::GetScriptWitnessStackNum();
      if (iVar2 != 0) {
        local_62 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        this_00 = (CfdException *)local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_61 + 1),"Exist witness stack. OP_TRUE is unused.",
                   (allocator *)this_00);
        core::CfdException::CfdException
                  (this_00,(CfdError)((ulong)uVar4 >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        local_62 = 0;
        __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::AbstractTxIn::GetUnlockingScript();
      in_stack_ffffffffffffff17 = cfd::core::Script::IsEmpty();
      in_stack_ffffffffffffff16 = in_stack_ffffffffffffff17 ^ 0xff;
      core::Script::~Script(in_stack_ffffffffffffff00);
      if ((in_stack_ffffffffffffff16 & 1) != 0) {
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"Exist scriptsig. OP_TRUE is unused.",&local_c1);
        core::CfdException::CfdException
                  (in_stack_ffffffffffffff20,error_code,
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_1 = 1;
      goto LAB_0039cd97;
    }
  }
  local_1 = 0;
LAB_0039cd97:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  return (bool)(local_1 & 1);
}

Assistant:

bool TransactionContextUtil::IsOpTrueLockingScript(
    const UtxoData& utxo, const AbstractTxIn* txin) {
  std::vector<ScriptElement> locking_script_items =
      utxo.locking_script.GetElementList();
  if (locking_script_items.size() == 1) {
    if (locking_script_items[0].GetOpCode() == ScriptOperator::OP_TRUE) {
      if (txin->GetScriptWitnessStackNum() != 0) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist witness stack. OP_TRUE is unused.");
      }
      if (!txin->GetUnlockingScript().IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist scriptsig. OP_TRUE is unused.");
      }
      return true;  // OP_TRUE only.
    }
  }
  return false;
}